

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

uint8 * __thiscall
bloaty::CustomDataSource::InternalSerializeWithCachedSizesToArray
          (CustomDataSource *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  Type *this_00;
  uint uVar5;
  uint uVar6;
  int index;
  uint8 *puVar7;
  uint8 *puVar8;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "bloaty.CustomDataSource.name");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(this->name_).ptr_,target);
  }
  if ((uVar5 & 2) != 0) {
    psVar2 = (this->base_data_source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "bloaty.CustomDataSource.base_data_source");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->base_data_source_).ptr_,target);
  }
  iVar1 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<bloaty::Regex>::TypeHandler>
                          (&(this->rewrite_).super_RepeatedPtrFieldBase,index);
      *target = '\x1a';
      uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar7 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar7 = target + 3;
        }
        else {
          puVar7 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar8 = puVar7;
            puVar8[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar7 = puVar8 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar8 = (uint8)uVar6;
        }
      }
      target = Regex::InternalSerializeWithCachedSizesToArray(this_00,puVar7,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
    return puVar7;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CustomDataSource::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.CustomDataSource)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string base_data_source = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_base_data_source().data(), static_cast<int>(this->_internal_base_data_source().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.base_data_source");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_base_data_source(), target);
  }

  // repeated .bloaty.Regex rewrite = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_rewrite_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_rewrite(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.CustomDataSource)
  return target;
}